

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3Codec.cpp
# Opt level: O2

uint8_t * AC3Codec::findFrame(uint8_t *buffer,uint8_t *end)

{
  if (buffer != (uint8_t *)0x0) {
    for (; buffer < end + -1; buffer = buffer + 1) {
      if ((*buffer == '\v') && (buffer[1] == 'w')) {
        return buffer;
      }
    }
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t *AC3Codec::findFrame(uint8_t *buffer, const uint8_t *end)
{
    if (buffer == nullptr)
        return nullptr;
    uint8_t *curBuf = buffer;
    while (curBuf < end - 1)
    {
        if (*curBuf == 0x0B && curBuf[1] == 0x77)
            return curBuf;
        curBuf++;
    }
    return nullptr;
}